

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O2

type unodb::qsbr_state::inc_epoch_dec_thread_count_reset_previous(type word)

{
  qsbr_epoch qVar1;
  qsbr_epoch epoch;
  bool bVar2;
  qsbr_thread_count_type qVar3;
  qsbr_thread_count_type qVar4;
  type tVar5;
  ulong word_00;
  qsbr_epoch local_2b;
  qsbr_epoch local_2a;
  qsbr_epoch local_29;
  
  assert_invariants(word);
  qVar3 = get_thread_count(word);
  if (qVar3 == 0) {
    __assert_fail("old_thread_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x170,
                  "static type unodb::qsbr_state::inc_epoch_dec_thread_count_reset_previous(type)");
  }
  qVar4 = get_threads_in_previous_epoch(word);
  if (qVar4 != 1) {
    __assert_fail("get_threads_in_previous_epoch(word) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x171,
                  "static type unodb::qsbr_state::inc_epoch_dec_thread_count_reset_previous(type)");
  }
  qVar1 = get_epoch(word);
  local_2b = qVar1;
  epoch = detail::qsbr_epoch::advance(&local_2b,1);
  tVar5 = make_from_epoch(epoch);
  qVar3 = qVar3 - 1;
  word_00 = CONCAT44(qVar3,qVar3) | tVar5;
  local_29 = qVar1;
  local_2a = detail::qsbr_epoch::advance(&local_29,1);
  qVar1 = get_epoch(word_00);
  bVar2 = detail::qsbr_epoch::operator==(&local_2a,qVar1);
  if (!bVar2) {
    __assert_fail("get_epoch(word).advance() == get_epoch(result)",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x17b,
                  "static type unodb::qsbr_state::inc_epoch_dec_thread_count_reset_previous(type)");
  }
  qVar4 = get_thread_count(word_00);
  if (qVar3 == qVar4) {
    qVar4 = get_threads_in_previous_epoch(word_00);
    if (qVar4 == qVar3) {
      assert_invariants(word_00);
      return word_00;
    }
    __assert_fail("get_threads_in_previous_epoch(result) == get_thread_count(result)",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x17e,
                  "static type unodb::qsbr_state::inc_epoch_dec_thread_count_reset_previous(type)");
  }
  __assert_fail("get_thread_count(word) - 1 == get_thread_count(result)",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                ,0x17c,
                "static type unodb::qsbr_state::inc_epoch_dec_thread_count_reset_previous(type)");
}

Assistant:

[[nodiscard, gnu::const]] static constexpr type
  inc_epoch_dec_thread_count_reset_previous(type word) noexcept {
    assert_invariants(word);
    const auto old_thread_count = get_thread_count(word);
    UNODB_DETAIL_ASSERT(old_thread_count > 0);
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(word) == 1);

    const auto new_word_with_epoch = make_from_epoch(get_epoch(word).advance());
    const auto new_thread_count = old_thread_count - 1;
    const auto new_word_with_thread_count = static_cast<type>(new_thread_count)
                                            << thread_count_in_word_offset;
    const auto new_threads_in_previous = new_thread_count;
    const auto result = new_word_with_epoch | new_word_with_thread_count |
                        new_threads_in_previous;

    UNODB_DETAIL_ASSERT(get_epoch(word).advance() == get_epoch(result));
    UNODB_DETAIL_ASSERT(get_thread_count(word) - 1 == get_thread_count(result));
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(result) ==
                        get_thread_count(result));
    assert_invariants(result);

    return result;
  }